

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 auVar2 [16];
  greatest_test_res gVar3;
  flow_t fVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  MaxFlowResult *pMVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int32_t iVar13;
  char *pcVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  uchar uVar20;
  char **ppcVar21;
  bool bVar22;
  FlowNetwork net;
  MaxFlowResult result;
  MaxFlow mf;
  FlowNetwork local_b8;
  MaxFlowResult local_a8;
  char **local_90;
  ulong local_88;
  uint local_7c;
  MaxFlow local_78;
  
  GREATEST_INIT();
  if (1 < argc) {
    iVar17 = 1;
    local_88 = CONCAT44(local_88._4_4_,argc);
    bVar15 = greatest_info.flags;
    uVar20 = greatest_info.verbosity;
    local_90 = argv;
    do {
      pcVar14 = argv[iVar17];
      if (*pcVar14 != '-') goto LAB_00101eb4;
      iVar10 = (byte)pcVar14[1] - 0x65;
      switch(iVar10) {
      case 0:
switchD_00101e15_caseD_0:
        greatest_info.exact_name_match = '\x01';
        break;
      case 1:
switchD_00101e15_caseD_1:
        bVar15 = bVar15 | 1;
        greatest_info.flags = bVar15;
        break;
      case 2:
      case 4:
      case 5:
      case 6:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0x10:
      case 0x12:
switchD_00101e15_caseD_2:
        iVar10 = strncmp("--help",pcVar14,6);
        if (iVar10 == 0) {
          pcVar14 = *local_90;
LAB_00103fc7:
          greatest_usage(pcVar14);
          exit(0);
        }
        iVar10 = strcmp("--",pcVar14);
        if (iVar10 != 0) {
          fprintf(_stdout,"Unknown argument \'%s\'\n",pcVar14);
          pcVar14 = *local_90;
LAB_00103fab:
          greatest_usage(pcVar14);
          exit(1);
        }
        bVar22 = false;
        argv = local_90;
        argc = (int)local_88;
        goto LAB_00101eb0;
      case 3:
switchD_00101e15_caseD_3:
        pcVar14 = *argv;
        goto LAB_00103fc7;
      case 7:
switchD_00101e15_caseD_7:
        bVar15 = bVar15 | 2;
        greatest_info.flags = bVar15;
        break;
      case 0xe:
      case 0xf:
      case 0x13:
        iVar18 = iVar17 + 1;
        if (argc <= iVar18) {
          pcVar14 = *argv;
          goto LAB_00103fab;
        }
        switch(iVar10) {
        case 0:
          goto switchD_00101e15_caseD_0;
        case 1:
          goto switchD_00101e15_caseD_1;
        case 2:
        case 4:
        case 5:
        case 6:
        case 8:
        case 9:
        case 10:
        case 0xb:
        case 0xc:
        case 0xd:
        case 0x10:
        case 0x12:
          goto switchD_00101e15_caseD_2;
        case 3:
          goto switchD_00101e15_caseD_3;
        case 7:
          goto switchD_00101e15_caseD_7;
        case 0xe:
          greatest_info.suite_filter = argv[iVar18];
          break;
        case 0xf:
          greatest_info.test_filter = argv[iVar18];
          break;
        case 0x11:
          goto switchD_00101e15_caseD_11;
        case 0x13:
          greatest_info.test_exclude = argv[iVar18];
          break;
        default:
          goto switchD_00101e15_default;
        }
        bVar22 = true;
        iVar17 = iVar18;
        goto LAB_00101eb0;
      case 0x11:
switchD_00101e15_caseD_11:
        uVar20 = uVar20 + '\x01';
        greatest_info.verbosity = uVar20;
        break;
      default:
switchD_00101e15_default:
        if (pcVar14[1] != 0x61) goto switchD_00101e15_caseD_2;
        bVar15 = bVar15 | 4;
        greatest_info.flags = bVar15;
      }
      bVar22 = true;
LAB_00101eb0:
      if (!bVar22) break;
LAB_00101eb4:
      iVar17 = iVar17 + 1;
    } while (iVar17 < argc);
  }
  iVar17 = greatest_test_pre("weird_network");
  if (iVar17 == 1) {
    local_b8._0_8_ = 0;
    local_b8.caps = (flow_t *)0x0;
    local_78.payload._32_8_ = 0;
    local_78.payload.field_1.list = (int32_t *)0x0;
    local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
    local_78.payload.field_1.flows = (flow_t *)0x0;
    local_78.payload.field_1.height = (int32_t *)0x0;
    local_78.nnodes = 0;
    local_78.s = 0;
    local_78.t = 0;
    local_78.kind = MAXFLOW_ALGO_INVALID;
    local_a8.nnodes = 0;
    local_a8.s = 0;
    local_a8.t = 0;
    local_a8.maxflow = 0;
    local_a8.colors = (int *)0x0;
    flow_network_create(&local_b8,4);
    max_flow_create(&local_78,4,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&local_a8,4);
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    if (local_b8.nnodes == 2) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 2] = 0x28;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 1] = 0x3c;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    local_b8.caps[local_b8.nnodes] = 0x50;
    if ((long)local_b8.nnodes < 1) goto LAB_00103cca;
    if ((local_b8.nnodes == 1) || (local_b8.caps[1] = 0x28, local_b8.nnodes < 4)) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 3] = 0x28;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 1] = 0x14;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2] = 0x14;
    if (local_b8.nnodes < 1) goto LAB_00103cca;
    if (local_b8.nnodes < 3) goto LAB_00103ce9;
    local_b8.caps[2] = 0x14;
    if ((local_b8.nnodes == 3) ||
       (local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3] = 0x3c, local_b8.nnodes < 1))
    goto LAB_00103cca;
    if (local_b8.nnodes < 4) goto LAB_00103ce9;
    local_b8.caps[3] = 0x50;
    max_flow_single_pair(&local_b8,&local_78,1,0,&local_a8);
    gVar3 = validate_with_slow_max_flow(&local_b8,1,0,&local_a8);
    if (gVar3 == GREATEST_TEST_RES_PASS) {
      max_flow_result_destroy(&local_a8);
      max_flow_destroy(&local_78);
      flow_network_destroy(&local_b8);
      greatest_info.msg = (char *)0x0;
      gVar3 = GREATEST_TEST_RES_PASS;
    }
    greatest_test_post(gVar3);
  }
  iVar17 = greatest_test_pre("weird_network2");
  if (iVar17 == 1) {
    local_b8._0_8_ = 0;
    local_b8.caps = (flow_t *)0x0;
    local_78.payload._32_8_ = 0;
    local_78.payload.field_1.list = (int32_t *)0x0;
    local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
    local_78.payload.field_1.flows = (flow_t *)0x0;
    local_78.payload.field_1.height = (int32_t *)0x0;
    local_78.nnodes = 0;
    local_78.s = 0;
    local_78.t = 0;
    local_78.kind = MAXFLOW_ALGO_INVALID;
    local_a8.nnodes = 0;
    local_a8.s = 0;
    local_a8.t = 0;
    local_a8.maxflow = 0;
    local_a8.colors = (int *)0x0;
    flow_network_create(&local_b8,4);
    max_flow_create(&local_78,4,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&local_a8,4);
    if (local_b8.nnodes < 1) goto LAB_00103cca;
    *local_b8.caps = 0;
    if ((long)local_b8.nnodes < 1) goto LAB_00103cca;
    if (((local_b8.nnodes == 1) || (local_b8.caps[1] = 0x50, local_b8.nnodes < 3)) ||
       (local_b8.caps[2] = 0x50, local_b8.nnodes == 3)) goto LAB_00103ce9;
    local_b8.caps[3] = 0;
    local_b8.caps[local_b8.nnodes] = 0;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    local_b8.caps[(long)local_b8.nnodes + 1] = 0;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    if (local_b8.nnodes == 2) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 2] = 0;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    if (local_b8.nnodes < 4) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 3] = 0;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2] = 0x14;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 1] = 0x3c;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 2] = 0;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    if (local_b8.nnodes == 3) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 3] = 0x3c;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3] = 0;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 1] = 0x14;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 2] = 0x50;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 3] = 0;
    max_flow_single_pair(&local_b8,&local_78,2,3,&local_a8);
    gVar3 = validate_with_slow_max_flow(&local_b8,2,3,&local_a8);
    if (gVar3 == GREATEST_TEST_RES_PASS) {
      max_flow_result_destroy(&local_a8);
      max_flow_destroy(&local_78);
      flow_network_destroy(&local_b8);
      greatest_info.msg = (char *)0x0;
      gVar3 = GREATEST_TEST_RES_PASS;
    }
    greatest_test_post(gVar3);
  }
  iVar17 = greatest_test_pre("weird_network3");
  if (iVar17 == 1) {
    local_b8._0_8_ = 0;
    local_b8.caps = (flow_t *)0x0;
    local_78.payload._32_8_ = 0;
    local_78.payload.field_1.list = (int32_t *)0x0;
    local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
    local_78.payload.field_1.flows = (flow_t *)0x0;
    local_78.payload.field_1.height = (int32_t *)0x0;
    local_78.nnodes = 0;
    local_78.s = 0;
    local_78.t = 0;
    local_78.kind = MAXFLOW_ALGO_INVALID;
    local_a8.nnodes = 0;
    local_a8.s = 0;
    local_a8.t = 0;
    local_a8.maxflow = 0;
    local_a8.colors = (int *)0x0;
    flow_network_create(&local_b8,5);
    max_flow_create(&local_78,5,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&local_a8,5);
    if (local_b8.nnodes < 1) goto LAB_00103cca;
    *local_b8.caps = 0;
    if ((long)local_b8.nnodes < 1) goto LAB_00103cca;
    if (((local_b8.nnodes == 1) || (local_b8.caps[1] = 0x28, local_b8.nnodes < 3)) ||
       ((local_b8.caps[2] = 0x50, local_b8.nnodes == 3 ||
        (local_b8.caps[3] = 0x3c, local_b8.nnodes < 5)))) goto LAB_00103ce9;
    local_b8.caps[4] = 0x50;
    local_b8.caps[local_b8.nnodes] = 0x50;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    local_b8.caps[(long)local_b8.nnodes + 1] = 0;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    if (local_b8.nnodes == 2) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 2] = 0x14;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    if (local_b8.nnodes < 4) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 3] = 0x28;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    if (local_b8.nnodes < 5) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 4] = 0x50;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2] = 0x50;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 1] = 0x3c;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 2] = 0;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    if (local_b8.nnodes == 3) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 3] = 0x3c;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    if (local_b8.nnodes < 5) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 4] = 0x50;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3] = 0x28;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 1] = 0x3c;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 2] = 0x14;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 3] = 0;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    if (local_b8.nnodes == 4) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 4] = 0x14;
    if (((local_b8.nnodes < 5) ||
        (local_b8.caps[(uint)(local_b8.nnodes << 2)] = 0, local_b8.nnodes < 5)) ||
       ((local_b8.caps[(ulong)(uint)(local_b8.nnodes << 2) + 1] = 0x28, local_b8.nnodes < 5 ||
        ((local_b8.caps[(ulong)(uint)(local_b8.nnodes << 2) + 2] = 0x50, local_b8.nnodes < 5 ||
         (local_b8.caps[(ulong)(uint)(local_b8.nnodes << 2) + 3] = 0x50, local_b8.nnodes < 5))))))
    goto LAB_00103cca;
    local_b8.caps[(ulong)(uint)(local_b8.nnodes << 2) + 4] = 0;
    max_flow_single_pair(&local_b8,&local_78,0,2,&local_a8);
    gVar3 = validate_with_slow_max_flow(&local_b8,0,2,&local_a8);
    if (gVar3 == GREATEST_TEST_RES_PASS) {
      max_flow_result_destroy(&local_a8);
      max_flow_destroy(&local_78);
      flow_network_destroy(&local_b8);
      greatest_info.msg = (char *)0x0;
      gVar3 = GREATEST_TEST_RES_PASS;
    }
    greatest_test_post(gVar3);
  }
  iVar17 = greatest_test_pre("CLRS_network");
  if (iVar17 == 1) {
    local_b8._0_8_ = 0;
    local_b8.caps = (flow_t *)0x0;
    local_78.payload._32_8_ = 0;
    local_78.payload.field_1.list = (int32_t *)0x0;
    local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
    local_78.payload.field_1.flows = (flow_t *)0x0;
    local_78.payload.field_1.height = (int32_t *)0x0;
    local_78.nnodes = 0;
    local_78.s = 0;
    local_78.t = 0;
    local_78.kind = MAXFLOW_ALGO_INVALID;
    local_a8.nnodes = 0;
    local_a8.s = 0;
    local_a8.t = 0;
    local_a8.maxflow = 0;
    local_a8.colors = (int *)0x0;
    flow_network_create(&local_b8,6);
    max_flow_create(&local_78,6,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&local_a8,6);
    if ((long)local_b8.nnodes < 1) goto LAB_00103cca;
    if ((local_b8.nnodes == 1) || (local_b8.caps[1] = 0x10, local_b8.nnodes < 3)) goto LAB_00103ce9;
    local_b8.caps[2] = 0xd;
    local_b8.caps[(long)local_b8.nnodes + 2] = 10;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 1] = 0x28;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    if (local_b8.nnodes < 4) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 3] = 0xc;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 2] = 9;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    if (local_b8.nnodes < 5) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 4] = 0xe;
    if (local_b8.nnodes < 5) goto LAB_00103cca;
    local_b8.caps[(ulong)(uint)(local_b8.nnodes << 2) + 3] = 7;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    if (local_b8.nnodes < 6) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 5] = 0x14;
    if (local_b8.nnodes < 5) goto LAB_00103cca;
    if (local_b8.nnodes == 5) goto LAB_00103ce9;
    local_b8.caps[(ulong)(uint)(local_b8.nnodes << 2) + 5] = 4;
    fVar4 = max_flow_single_pair(&local_b8,&local_78,0,5,&local_a8);
    if (fVar4 == 0x17) {
      if (*local_a8.colors != 0) {
        greatest_info.fail_line = 0x107;
        greatest_info.msg = "BLACK != result.colors[0]";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_00102800;
      }
      if (local_a8.colors[1] != 0) {
        greatest_info.fail_line = 0x108;
        greatest_info.msg = "BLACK != result.colors[1]";
        greatest_info.assertions = greatest_info.assertions + 3;
        goto LAB_00102800;
      }
      if (local_a8.colors[2] != 0) {
        greatest_info.fail_line = 0x109;
        greatest_info.msg = "BLACK != result.colors[2]";
        greatest_info.assertions = greatest_info.assertions + 4;
        goto LAB_00102800;
      }
      if (local_a8.colors[3] != 1) {
        greatest_info.fail_line = 0x10a;
        greatest_info.msg = "WHITE != result.colors[3]";
        greatest_info.assertions = greatest_info.assertions + 5;
        goto LAB_00102800;
      }
      if (local_a8.colors[4] != 0) {
        greatest_info.fail_line = 0x10b;
        greatest_info.msg = "BLACK != result.colors[4]";
        greatest_info.assertions = greatest_info.assertions + 6;
        goto LAB_00102800;
      }
      greatest_info.assertions = greatest_info.assertions + 7;
      if (local_a8.colors[5] != 1) {
        greatest_info.fail_line = 0x10c;
        greatest_info.msg = "WHITE != result.colors[5]";
        goto LAB_00102800;
      }
      gVar3 = validate_with_slow_max_flow(&local_b8,0,5,&local_a8);
      if (gVar3 == GREATEST_TEST_RES_PASS) {
        max_flow_result_destroy(&local_a8);
        max_flow_destroy(&local_78);
        flow_network_destroy(&local_b8);
        greatest_info.msg = (char *)0x0;
        gVar3 = GREATEST_TEST_RES_PASS;
      }
    }
    else {
      greatest_info.fail_line = 0x106;
      greatest_info.msg = "23 != max_flow";
      greatest_info.assertions = greatest_info.assertions + 1;
LAB_00102800:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      gVar3 = GREATEST_TEST_RES_FAIL;
      if ((greatest_info.flags & 4) != 0) goto LAB_00103f7e;
    }
    greatest_test_post(gVar3);
  }
  iVar17 = greatest_test_pre("non_trivial_network1");
  if (iVar17 == 1) {
    local_b8._0_8_ = 0;
    local_b8.caps = (flow_t *)0x0;
    local_78.payload._32_8_ = 0;
    local_78.payload.field_1.list = (int32_t *)0x0;
    local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
    local_78.payload.field_1.flows = (flow_t *)0x0;
    local_78.payload.field_1.height = (int32_t *)0x0;
    local_78.nnodes = 0;
    local_78.s = 0;
    local_78.t = 0;
    local_78.kind = MAXFLOW_ALGO_INVALID;
    local_a8.nnodes = 0;
    local_a8.s = 0;
    local_a8.t = 0;
    local_a8.maxflow = 0;
    local_a8.colors = (int *)0x0;
    flow_network_create(&local_b8,7);
    max_flow_create(&local_78,7,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&local_a8,7);
    if (local_b8.nnodes < 1) goto LAB_00103cca;
    if (local_b8.nnodes < 4) goto LAB_00103ce9;
    local_b8.caps[3] = 2;
    local_b8.caps[1] = 2;
    if (local_b8.nnodes == 4) goto LAB_00103ce9;
    local_b8.caps[4] = 2;
    local_b8.caps[(ulong)(uint)(local_b8.nnodes << 2) + 1] = 1;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    if (local_b8.nnodes < 4) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 3] = 1;
    if (local_b8.nnodes < 5) goto LAB_00103cca;
    if (local_b8.nnodes == 5) goto LAB_00103ce9;
    local_b8.caps[(ulong)(uint)(local_b8.nnodes << 2) + 5] = 2;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    if (local_b8.nnodes < 6) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 5] = 2;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    if (local_b8.nnodes == 2) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 2] = 2;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 2] = 1;
    if (local_b8.nnodes < 6) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 5 + 2] = 1;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    if (local_b8.nnodes < 7) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 6] = 2;
    if (local_b8.nnodes < 6) goto LAB_00103cca;
    if (local_b8.nnodes == 6) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 5 + 6] = 4;
    fVar4 = max_flow_single_pair(&local_b8,&local_78,0,6,&local_a8);
    if (fVar4 == 5) {
      if (*local_a8.colors != 0) {
        greatest_info.fail_line = 0x138;
        greatest_info.msg = "BLACK != result.colors[1 - 1]";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_00102a3e;
      }
      if (local_a8.colors[1] != 1) {
        greatest_info.fail_line = 0x139;
        greatest_info.msg = "WHITE != result.colors[2 - 1]";
        greatest_info.assertions = greatest_info.assertions + 3;
        goto LAB_00102a3e;
      }
      if (local_a8.colors[2] != 1) {
        greatest_info.fail_line = 0x13a;
        greatest_info.msg = "WHITE != result.colors[3 - 1]";
        greatest_info.assertions = greatest_info.assertions + 4;
        goto LAB_00102a3e;
      }
      if (local_a8.colors[3] != 0) {
        greatest_info.fail_line = 0x13b;
        greatest_info.msg = "BLACK != result.colors[4 - 1]";
        greatest_info.assertions = greatest_info.assertions + 5;
        goto LAB_00102a3e;
      }
      if (local_a8.colors[4] != 1) {
        greatest_info.fail_line = 0x13c;
        greatest_info.msg = "WHITE != result.colors[5 - 1]";
        greatest_info.assertions = greatest_info.assertions + 6;
        goto LAB_00102a3e;
      }
      if (local_a8.colors[5] != 1) {
        greatest_info.fail_line = 0x13d;
        greatest_info.msg = "WHITE != result.colors[6 - 1]";
        greatest_info.assertions = greatest_info.assertions + 7;
        goto LAB_00102a3e;
      }
      greatest_info.assertions = greatest_info.assertions + 8;
      if (local_a8.colors[6] != 1) {
        greatest_info.fail_line = 0x13e;
        greatest_info.msg = "WHITE != result.colors[7 - 1]";
        goto LAB_00102a3e;
      }
      gVar3 = validate_with_slow_max_flow(&local_b8,0,6,&local_a8);
      if (gVar3 == GREATEST_TEST_RES_PASS) {
        max_flow_result_destroy(&local_a8);
        max_flow_destroy(&local_78);
        flow_network_destroy(&local_b8);
        greatest_info.msg = (char *)0x0;
        gVar3 = GREATEST_TEST_RES_PASS;
      }
    }
    else {
      greatest_info.fail_line = 0x137;
      greatest_info.msg = "5 != max_flow";
      greatest_info.assertions = greatest_info.assertions + 1;
LAB_00102a3e:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      gVar3 = GREATEST_TEST_RES_FAIL;
      if ((greatest_info.flags & 4) != 0) goto LAB_00103f7e;
    }
    greatest_test_post(gVar3);
  }
  iVar17 = greatest_test_pre("non_trivial_network2");
  if (iVar17 == 1) {
    local_b8._0_8_ = 0;
    local_b8.caps = (flow_t *)0x0;
    local_78.payload._32_8_ = 0;
    local_78.payload.field_1.list = (int32_t *)0x0;
    local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
    local_78.payload.field_1.flows = (flow_t *)0x0;
    local_78.payload.field_1.height = (int32_t *)0x0;
    local_78.nnodes = 0;
    local_78.s = 0;
    local_78.t = 0;
    local_78.kind = MAXFLOW_ALGO_INVALID;
    local_a8.nnodes = 0;
    local_a8.s = 0;
    local_a8.t = 0;
    local_a8.maxflow = 0;
    local_a8.colors = (int *)0x0;
    flow_network_create(&local_b8,7);
    max_flow_create(&local_78,7,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&local_a8,7);
    if (local_b8.nnodes < 1) goto LAB_00103cca;
    if (((local_b8.nnodes == 1) || (local_b8.caps[1] = 6, local_b8.nnodes < 4)) ||
       (local_b8.caps[3] = 5, local_b8.nnodes == 4)) goto LAB_00103ce9;
    local_b8.caps[4] = 10;
    local_b8.caps[(ulong)(uint)(local_b8.nnodes << 2) + 3] = 0xc;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 1] = 5;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 2] = 7;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    if (local_b8.nnodes == 2) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 2] = 5;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    if (local_b8.nnodes < 6) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 5] = 0xc;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    if (local_b8.nnodes < 6) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 5] = 0xc;
    if (local_b8.nnodes < 6) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 5 + 2] = 3;
    if (local_b8.nnodes < 6) goto LAB_00103cca;
    if (local_b8.nnodes == 6) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 5 + 6] = 0xf;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    if (local_b8.nnodes < 7) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 6] = 4;
    fVar4 = max_flow_single_pair(&local_b8,&local_78,0,6,&local_a8);
    if (fVar4 == 0xf) {
      if (*local_a8.colors != 0) {
        greatest_info.fail_line = 0x16a;
        greatest_info.msg = "BLACK != result.colors[1 - 1]";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_00102c80;
      }
      if (local_a8.colors[1] != 1) {
        greatest_info.fail_line = 0x16b;
        greatest_info.msg = "WHITE != result.colors[2 - 1]";
        greatest_info.assertions = greatest_info.assertions + 3;
        goto LAB_00102c80;
      }
      if (local_a8.colors[2] != 0) {
        greatest_info.fail_line = 0x16c;
        greatest_info.msg = "BLACK != result.colors[3 - 1]";
        greatest_info.assertions = greatest_info.assertions + 4;
        goto LAB_00102c80;
      }
      if (local_a8.colors[3] != 0) {
        greatest_info.fail_line = 0x16d;
        greatest_info.msg = "BLACK != result.colors[4 - 1]";
        greatest_info.assertions = greatest_info.assertions + 5;
        goto LAB_00102c80;
      }
      if (local_a8.colors[4] != 0) {
        greatest_info.fail_line = 0x16e;
        greatest_info.msg = "BLACK != result.colors[5 - 1]";
        greatest_info.assertions = greatest_info.assertions + 6;
        goto LAB_00102c80;
      }
      if (local_a8.colors[5] != 1) {
        greatest_info.fail_line = 0x16f;
        greatest_info.msg = "WHITE != result.colors[6 - 1]";
        greatest_info.assertions = greatest_info.assertions + 7;
        goto LAB_00102c80;
      }
      greatest_info.assertions = greatest_info.assertions + 8;
      if (local_a8.colors[6] != 1) {
        greatest_info.fail_line = 0x170;
        greatest_info.msg = "WHITE != result.colors[7 - 1]";
        goto LAB_00102c80;
      }
      gVar3 = validate_with_slow_max_flow(&local_b8,0,6,&local_a8);
      if (gVar3 == GREATEST_TEST_RES_PASS) {
        max_flow_result_destroy(&local_a8);
        max_flow_destroy(&local_78);
        flow_network_destroy(&local_b8);
        greatest_info.msg = (char *)0x0;
        gVar3 = GREATEST_TEST_RES_PASS;
      }
    }
    else {
      greatest_info.fail_line = 0x169;
      greatest_info.msg = "15 != max_flow";
      greatest_info.assertions = greatest_info.assertions + 1;
LAB_00102c80:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      gVar3 = GREATEST_TEST_RES_FAIL;
      if ((greatest_info.flags & 4) != 0) goto LAB_00103f7e;
    }
    greatest_test_post(gVar3);
  }
  iVar17 = greatest_test_pre("non_trivial_network3");
  if (iVar17 == 1) {
    local_b8._0_8_ = 0;
    local_b8.caps = (flow_t *)0x0;
    local_78.payload._32_8_ = 0;
    local_78.payload.field_1.list = (int32_t *)0x0;
    local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
    local_78.payload.field_1.flows = (flow_t *)0x0;
    local_78.payload.field_1.height = (int32_t *)0x0;
    local_78.nnodes = 0;
    local_78.s = 0;
    local_78.t = 0;
    local_78.kind = MAXFLOW_ALGO_INVALID;
    local_a8.nnodes = 0;
    local_a8.s = 0;
    local_a8.t = 0;
    local_a8.maxflow = 0;
    local_a8.colors = (int *)0x0;
    flow_network_create(&local_b8,8);
    max_flow_create(&local_78,8,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&local_a8,8);
    if (local_b8.nnodes < 1) goto LAB_00103cca;
    if (local_b8.nnodes < 5) goto LAB_00103ce9;
    local_b8.caps[4] = 7;
    local_b8.caps[1] = 3;
    if (local_b8.nnodes == 5) goto LAB_00103ce9;
    local_b8.caps[5] = 3;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 5 + 1] = 5;
    if (local_b8.nnodes < 5) goto LAB_00103cca;
    local_b8.caps[(ulong)(uint)(local_b8.nnodes << 2) + 1] = 1;
    if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
    if (local_b8.nnodes == 2) goto LAB_00103ce9;
    local_b8.caps[(long)local_b8.nnodes + 2] = 2;
    if (local_b8.nnodes < 5) goto LAB_00103cca;
    local_b8.caps[(ulong)(uint)(local_b8.nnodes << 2) + 3] = 7;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 1] = 2;
    if (local_b8.nnodes < 6) goto LAB_00103cca;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 5 + 2] = 3;
    if (local_b8.nnodes < 6) goto LAB_00103cca;
    if (local_b8.nnodes == 6) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 5 + 6] = 3;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    if (local_b8.nnodes < 7) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 6] = 5;
    if (local_b8.nnodes < 3) goto LAB_00103cca;
    if (local_b8.nnodes == 3) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 3] = 2;
    if (local_b8.nnodes < 7) goto LAB_00103cca;
    if (local_b8.nnodes == 7) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 6 + 7] = 6;
    if (local_b8.nnodes < 4) goto LAB_00103cca;
    if (local_b8.nnodes < 8) goto LAB_00103ce9;
    local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 3 + 7] = 5;
    fVar4 = max_flow_single_pair(&local_b8,&local_78,0,7,&local_a8);
    if (fVar4 == 10) {
      if (*local_a8.colors != 0) {
        greatest_info.fail_line = 0x19d;
        greatest_info.msg = "BLACK != result.colors[1 - 1]";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_00102ef1;
      }
      if (local_a8.colors[1] != 0) {
        greatest_info.fail_line = 0x19e;
        greatest_info.msg = "BLACK != result.colors[2 - 1]";
        greatest_info.assertions = greatest_info.assertions + 3;
        goto LAB_00102ef1;
      }
      if (local_a8.colors[2] != 1) {
        greatest_info.fail_line = 0x19f;
        greatest_info.msg = "WHITE != result.colors[3 - 1]";
        greatest_info.assertions = greatest_info.assertions + 4;
        goto LAB_00102ef1;
      }
      if (local_a8.colors[3] != 0) {
        greatest_info.fail_line = 0x1a0;
        greatest_info.msg = "BLACK != result.colors[4 - 1]";
        greatest_info.assertions = greatest_info.assertions + 5;
        goto LAB_00102ef1;
      }
      if (local_a8.colors[4] != 0) {
        greatest_info.fail_line = 0x1a1;
        greatest_info.msg = "BLACK != result.colors[5 - 1]";
        greatest_info.assertions = greatest_info.assertions + 6;
        goto LAB_00102ef1;
      }
      if (local_a8.colors[5] != 1) {
        greatest_info.fail_line = 0x1a2;
        greatest_info.msg = "WHITE != result.colors[6 - 1]";
        greatest_info.assertions = greatest_info.assertions + 7;
        goto LAB_00102ef1;
      }
      if (local_a8.colors[6] != 1) {
        greatest_info.fail_line = 0x1a3;
        greatest_info.msg = "WHITE != result.colors[7 - 1]";
        greatest_info.assertions = greatest_info.assertions + 8;
        goto LAB_00102ef1;
      }
      greatest_info.assertions = greatest_info.assertions + 9;
      if (local_a8.colors[7] != 1) {
        greatest_info.fail_line = 0x1a4;
        greatest_info.msg = "WHITE != result.colors[8 - 1]";
        goto LAB_00102ef1;
      }
      gVar3 = validate_with_slow_max_flow(&local_b8,0,7,&local_a8);
      if (gVar3 == GREATEST_TEST_RES_PASS) {
        max_flow_result_destroy(&local_a8);
        max_flow_destroy(&local_78);
        flow_network_destroy(&local_b8);
        greatest_info.msg = (char *)0x0;
        gVar3 = GREATEST_TEST_RES_PASS;
      }
    }
    else {
      greatest_info.fail_line = 0x19c;
      greatest_info.msg = "10 != max_flow";
      greatest_info.assertions = greatest_info.assertions + 1;
LAB_00102ef1:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      gVar3 = GREATEST_TEST_RES_FAIL;
      if ((greatest_info.flags & 4) != 0) goto LAB_00103f7e;
    }
    greatest_test_post(gVar3);
  }
  iVar17 = greatest_test_pre("no_path_flow");
  if (iVar17 != 1) goto LAB_0010355b;
  local_b8._0_8_ = 0;
  local_b8.caps = (flow_t *)0x0;
  local_78.payload._32_8_ = 0;
  local_78.payload.field_1.list = (int32_t *)0x0;
  local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
  local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
  local_78.payload.field_1.flows = (flow_t *)0x0;
  local_78.payload.field_1.height = (int32_t *)0x0;
  local_78.nnodes = 0;
  local_78.s = 0;
  local_78.t = 0;
  local_78.kind = MAXFLOW_ALGO_INVALID;
  local_a8.nnodes = 0;
  local_a8.s = 0;
  local_a8.t = 0;
  local_a8.maxflow = 0;
  local_a8.colors = (int *)0x0;
  flow_network_create(&local_b8,4);
  max_flow_create(&local_78,4,MAXFLOW_ALGO_PUSH_RELABEL);
  max_flow_result_create(&local_a8,4);
  if ((long)local_b8.nnodes < 1) goto LAB_00103cca;
  if (local_b8.nnodes == 1) {
LAB_00103ce9:
    __assert_fail("j >= 0 && j < net->nnodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/../src/maxflow.h"
                  ,0x71,"void flow_net_set_cap(FlowNetwork *, int32_t, int32_t, flow_t)");
  }
  local_b8.caps[1] = 2;
  local_b8.caps[local_b8.nnodes] = 2;
  if ((long)local_b8.nnodes < 2) goto LAB_00103cca;
  if (local_b8.nnodes == 2) goto LAB_00103ce9;
  local_b8.caps[(long)local_b8.nnodes + 2] = 2;
  if (local_b8.nnodes < 3) {
LAB_00103cca:
    __assert_fail("i >= 0 && i < net->nnodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/../src/maxflow.h"
                  ,0x70,"void flow_net_set_cap(FlowNetwork *, int32_t, int32_t, flow_t)");
  }
  local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2 + 1] = 2;
  if ((local_b8.nnodes < 3) ||
     (local_b8.caps[(local_b8._0_8_ & 0xffffffff) * 2] = 2, local_b8.nnodes < 1)) goto LAB_00103cca;
  if (local_b8.nnodes < 3) goto LAB_00103ce9;
  local_b8.caps[2] = 2;
  fVar4 = max_flow_single_pair(&local_b8,&local_78,0,3,&local_a8);
  if (fVar4 == 0) {
    if (*local_a8.colors != 0) {
      greatest_info.fail_line = 0x1ca;
      greatest_info.msg = "BLACK != result.colors[0]";
      greatest_info.assertions = greatest_info.assertions + 2;
      goto LAB_0010353d;
    }
    if (local_a8.colors[1] != 0) {
      greatest_info.fail_line = 0x1cb;
      greatest_info.msg = "BLACK != result.colors[1]";
      greatest_info.assertions = greatest_info.assertions + 3;
      goto LAB_0010353d;
    }
    if (local_a8.colors[2] != 0) {
      greatest_info.fail_line = 0x1cc;
      greatest_info.msg = "BLACK != result.colors[2]";
      greatest_info.assertions = greatest_info.assertions + 4;
      goto LAB_0010353d;
    }
    greatest_info.assertions = greatest_info.assertions + 5;
    if (local_a8.colors[3] != 1) {
      greatest_info.fail_line = 0x1cd;
      greatest_info.msg = "WHITE != result.colors[3]";
      goto LAB_0010353d;
    }
    gVar3 = validate_with_slow_max_flow(&local_b8,0,3,&local_a8);
    if (gVar3 == GREATEST_TEST_RES_PASS) {
      max_flow_result_destroy(&local_a8);
      max_flow_destroy(&local_78);
      flow_network_destroy(&local_b8);
      greatest_info.msg = (char *)0x0;
      gVar3 = GREATEST_TEST_RES_PASS;
    }
  }
  else {
    greatest_info.fail_line = 0x1c9;
    greatest_info.msg = "0 != max_flow";
    greatest_info.assertions = greatest_info.assertions + 1;
LAB_0010353d:
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
    ;
    gVar3 = GREATEST_TEST_RES_FAIL;
    if ((greatest_info.flags & 4) != 0) {
LAB_00103f7e:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      abort();
    }
  }
  greatest_test_post(gVar3);
LAB_0010355b:
  iVar17 = greatest_test_pre("single_path_flow");
  if (iVar17 == 1) {
    ppcVar21 = (char **)0x2;
    iVar17 = 1;
    uVar9 = 0;
    do {
      local_88 = CONCAT44(local_88._4_4_,(int)uVar9);
      local_b8._0_8_ = 0;
      local_b8.caps = (flow_t *)0x0;
      local_78.payload._32_8_ = 0;
      local_78.payload.field_1.list = (int32_t *)0x0;
      local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
      local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
      local_78.payload.field_1.flows = (flow_t *)0x0;
      local_78.payload.field_1.height = (int32_t *)0x0;
      local_78.nnodes = 0;
      local_78.s = 0;
      local_78.t = 0;
      local_78.kind = MAXFLOW_ALGO_INVALID;
      local_a8.nnodes = 0;
      local_a8.s = 0;
      local_a8.t = 0;
      local_a8.maxflow = 0;
      local_a8.colors = (int *)0x0;
      iVar13 = (int32_t)ppcVar21;
      flow_network_create(&local_b8,iVar13);
      max_flow_create(&local_78,iVar13,MAXFLOW_ALGO_PUSH_RELABEL);
      max_flow_result_create(&local_a8,iVar13);
      iVar18 = 0x7fffffff;
      iVar11 = 1;
      iVar10 = 0;
      local_90 = ppcVar21;
      do {
        iVar5 = rand();
        iVar6 = rand();
        if (local_b8.nnodes <= iVar10) goto LAB_00103cca;
        iVar1 = iVar10 + 1;
        if (local_b8.nnodes <= iVar1) goto LAB_00103ce9;
        iVar5 = iVar5 % 10;
        local_b8.caps[local_b8.nnodes * iVar10 + iVar10 + 1] = iVar5;
        if (local_b8.nnodes <= iVar1) goto LAB_00103cca;
        if (iVar5 <= iVar18) {
          iVar18 = iVar5;
        }
        local_b8.caps[(uint)(iVar10 + local_b8.nnodes * iVar11)] = iVar6 % 10;
        iVar11 = iVar11 + 1;
        iVar10 = iVar1;
      } while (iVar17 != iVar1);
      fVar4 = max_flow_single_pair(&local_b8,&local_78,0,iVar13 + -1,&local_a8);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (iVar18 != fVar4) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
        ;
        greatest_info.fail_line = 499;
        greatest_info.msg = "min_cap != max_flow";
        if ((greatest_info.flags & 4) != 0) goto LAB_00103f7e;
LAB_00103737:
        iVar17 = -1;
        if ((local_88 & 1) == 0) goto LAB_00103750;
        break;
      }
      pMVar8 = &local_a8;
      gVar3 = validate_with_slow_max_flow(&local_b8,0,iVar13 + -1,&local_a8);
      if (gVar3 != GREATEST_TEST_RES_PASS) goto LAB_00103737;
      max_flow_result_destroy(&local_a8);
      max_flow_destroy(&local_78);
      flow_network_destroy(&local_b8);
      uVar9 = CONCAT71((int7)((ulong)pMVar8 >> 8),8 < (uint)local_90);
      iVar17 = iVar17 + 1;
      ppcVar21 = (char **)(ulong)((uint)local_90 + 1);
    } while (iVar17 != 9);
    greatest_info.msg = (char *)0x0;
    iVar17 = 0;
LAB_00103750:
    greatest_test_post(iVar17);
  }
  iVar17 = greatest_test_pre("two_path_flow");
  if (iVar17 == 1) {
    uVar19 = 2;
    uVar9 = 0;
    do {
      local_7c = (uint)uVar9;
      iVar17 = (int)uVar19;
      iVar10 = iVar17 * 2 + 2;
      local_b8._0_8_ = 0;
      local_b8.caps = (flow_t *)0x0;
      local_78.payload._32_8_ = 0;
      local_78.payload.field_1.list = (int32_t *)0x0;
      local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
      local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
      local_78.payload.field_1.flows = (flow_t *)0x0;
      local_78.payload.field_1.height = (int32_t *)0x0;
      local_78.nnodes = 0;
      local_78.s = 0;
      local_78.t = 0;
      local_78.kind = MAXFLOW_ALGO_INVALID;
      local_a8.nnodes = 0;
      local_a8.s = 0;
      local_a8.t = 0;
      local_a8.maxflow = 0;
      local_a8.colors = (int *)0x0;
      flow_network_create(&local_b8,iVar10);
      max_flow_create(&local_78,iVar10,MAXFLOW_ALGO_PUSH_RELABEL);
      max_flow_result_create(&local_a8,iVar10);
      if (local_b8.nnodes < 1) goto LAB_00103cca;
      if ((local_b8.nnodes == 1) || (local_b8.caps[1] = 99999, local_b8.nnodes < 3))
      goto LAB_00103ce9;
      uVar7 = iVar17 * 2;
      local_b8.caps[2] = 99999;
      if (SBORROW4(local_b8.nnodes,uVar7) != local_b8.nnodes + iVar17 * -2 < 0) goto LAB_00103cca;
      iVar10 = iVar17 * 2 + 1;
      if (local_b8.nnodes <= iVar10) goto LAB_00103ce9;
      local_b8.caps[local_b8.nnodes * (uVar7 - 1) + iVar10] = 99999;
      if (local_b8.nnodes == uVar7 ||
          SBORROW4(local_b8.nnodes,uVar7) != local_b8.nnodes + iVar17 * -2 < 0) goto LAB_00103cca;
      if (local_b8.nnodes <= iVar10) goto LAB_00103ce9;
      local_b8.caps[local_b8.nnodes * uVar7 + iVar10] = 99999;
      iVar17 = 0x7fffffff;
      iVar18 = 3;
      uVar16 = 1;
      local_88 = uVar19;
      do {
        iVar11 = rand();
        iVar5 = rand();
        if (local_b8.nnodes <= (int)uVar16) goto LAB_00103cca;
        uVar12 = uVar16 + 2;
        if (local_b8.nnodes <= (int)uVar12) goto LAB_00103ce9;
        iVar11 = iVar11 % 10;
        local_b8.caps[local_b8.nnodes * uVar16 + uVar16 + 2] = iVar11;
        if (local_b8.nnodes <= (int)uVar12) goto LAB_00103cca;
        if (iVar11 <= iVar17) {
          iVar17 = iVar11;
        }
        local_b8.caps[uVar16 + local_b8.nnodes * iVar18] = iVar5 % 10;
        iVar18 = iVar18 + 2;
        uVar16 = uVar12;
      } while (uVar12 < uVar7);
      local_90 = (char **)CONCAT44(local_90._4_4_,iVar10);
      iVar10 = 0x7fffffff;
      iVar18 = 4;
      uVar16 = 2;
      do {
        iVar11 = rand();
        iVar5 = rand();
        if (local_b8.nnodes <= (int)uVar16) goto LAB_00103cca;
        uVar12 = uVar16 + 2;
        if (local_b8.nnodes <= (int)uVar12) goto LAB_00103ce9;
        iVar11 = iVar11 % 10;
        local_b8.caps[local_b8.nnodes * uVar16 + uVar16 + 2] = iVar11;
        if (local_b8.nnodes <= (int)uVar12) goto LAB_00103cca;
        if (iVar11 <= iVar10) {
          iVar10 = iVar11;
        }
        local_b8.caps[uVar16 + local_b8.nnodes * iVar18] = iVar5 % 10;
        iVar18 = iVar18 + 2;
        uVar16 = uVar12;
      } while (uVar12 < uVar7);
      iVar13 = (int32_t)local_90;
      fVar4 = max_flow_single_pair(&local_b8,&local_78,0,(int32_t)local_90,&local_a8);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (iVar10 + iVar17 != fVar4) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
        ;
        greatest_info.fail_line = 0x236;
        greatest_info.msg = "min_cap1 + min_cap2 != max_flow";
        if ((greatest_info.flags & 4) != 0) goto LAB_00103f7e;
LAB_00103a67:
        iVar17 = -1;
        if ((local_7c & 1) == 0) goto LAB_00103a80;
        break;
      }
      pMVar8 = &local_a8;
      gVar3 = validate_with_slow_max_flow(&local_b8,0,iVar13,&local_a8);
      if (gVar3 != GREATEST_TEST_RES_PASS) goto LAB_00103a67;
      max_flow_result_destroy(&local_a8);
      max_flow_destroy(&local_78);
      flow_network_destroy(&local_b8);
      uVar7 = (uint)local_88 + 1;
      uVar9 = CONCAT71((int7)((ulong)pMVar8 >> 8),3 < (uint)local_88);
      uVar19 = (ulong)uVar7;
    } while (uVar7 != 5);
    greatest_info.msg = (char *)0x0;
    iVar17 = 0;
LAB_00103a80:
    greatest_test_post(iVar17);
  }
  iVar17 = greatest_test_pre("random_networks");
  if (iVar17 == 1) {
    uVar7 = 2;
    uVar9 = 0;
    do {
      local_7c = (uint)uVar9;
      local_88 = CONCAT44(local_88._4_4_,uVar7 - 1);
      iVar17 = 0;
      do {
        local_90 = (char **)CONCAT44(local_90._4_4_,iVar17);
        local_b8._0_8_ = 0;
        local_b8.caps = (flow_t *)0x0;
        local_78.payload._32_8_ = 0;
        local_78.payload.field_1.list = (int32_t *)0x0;
        local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
        local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
        local_78.payload.field_1.flows = (flow_t *)0x0;
        local_78.payload.field_1.height = (int32_t *)0x0;
        local_78.nnodes = 0;
        local_78.s = 0;
        local_78.t = 0;
        local_78.kind = MAXFLOW_ALGO_INVALID;
        local_a8.nnodes = 0;
        local_a8.s = 0;
        local_a8.t = 0;
        local_a8.maxflow = 0;
        local_a8.colors = (int *)0x0;
        flow_network_create(&local_b8,uVar7);
        max_flow_create(&local_78,uVar7,MAXFLOW_ALGO_PUSH_RELABEL);
        max_flow_result_create(&local_a8,uVar7);
        uVar16 = 0;
        iVar13 = (int)local_88;
        do {
          uVar12 = 0;
          do {
            if (uVar16 != uVar12) {
              iVar17 = rand();
              auVar2._8_8_ = 0;
              auVar2._0_8_ = (long)iVar17;
              if (local_b8.nnodes <= (int)uVar16) goto LAB_00103cca;
              if (local_b8.nnodes <= (int)uVar12) goto LAB_00103ce9;
              local_b8.caps[local_b8.nnodes * uVar16 + uVar12] =
                   *(flow_t *)
                    (&DAT_001060b0 +
                    (iVar17 + ((uint)((int)((ulong)((long)iVar17 -
                                                   SUB168(auVar2 * ZEXT816(0x2492492492492493),8))
                                           >> 1) + SUB164(auVar2 * ZEXT816(0x2492492492492493),8))
                              >> 2) * -7) * 4);
            }
            uVar12 = uVar12 + 1;
          } while (uVar7 != uVar12);
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar7);
        fVar4 = max_flow_single_pair(&local_b8,&local_78,0,iVar13,&local_a8);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (fVar4 != local_a8.maxflow) {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
          ;
          greatest_info.fail_line = 0x25f;
          greatest_info.msg = "max_flow != result.maxflow";
          if ((greatest_info.flags & 4) != 0) goto LAB_00103f7e;
LAB_00103c65:
          iVar17 = -1;
          if ((local_7c & 1) == 0) goto LAB_00103c7e;
          goto LAB_00103c71;
        }
        gVar3 = validate_with_slow_max_flow(&local_b8,0,iVar13,&local_a8);
        iVar17 = (int32_t)local_90;
        if (gVar3 != GREATEST_TEST_RES_PASS) goto LAB_00103c65;
        pMVar8 = &local_a8;
        gVar3 = validate_with_slow_max_flow(&local_b8,0,iVar13,pMVar8);
        if (gVar3 != GREATEST_TEST_RES_PASS) goto LAB_00103c65;
        max_flow_result_destroy(&local_a8);
        max_flow_destroy(&local_78);
        flow_network_destroy(&local_b8);
        iVar17 = iVar17 + 1;
      } while (iVar17 != 0x800);
      bVar22 = 9 < uVar7;
      uVar7 = uVar7 + 1;
      uVar9 = CONCAT71((int7)((ulong)pMVar8 >> 8),bVar22);
    } while (uVar7 != 0xb);
LAB_00103c71:
    greatest_info.msg = (char *)0x0;
    iVar17 = 0;
LAB_00103c7e:
    greatest_test_post(iVar17);
  }
  GREATEST_PRINT_REPORT();
  return (int)(greatest_info.failed != 0);
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(weird_network);
    RUN_TEST(weird_network2);
    RUN_TEST(weird_network3);
    RUN_TEST(CLRS_network);
    RUN_TEST(non_trivial_network1);
    RUN_TEST(non_trivial_network2);
    RUN_TEST(non_trivial_network3);
    RUN_TEST(no_path_flow);
    RUN_TEST(single_path_flow);
    RUN_TEST(two_path_flow);
    RUN_TEST(random_networks);

    GREATEST_MAIN_END(); /* display results */
}